

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::weight_from_sin
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx,batch sin_angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 in_EAX;
  int iVar3;
  uint uVar4;
  float fVar5;
  uint uVar6;
  float fVar7;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar8;
  float fVar9;
  ulong uVar10;
  batch<float,_xsimd::sse2> bVar11;
  batch bVar12;
  batch<float,_xsimd::sse2> local_18;
  
  local_18.super_simd_register<float,_xsimd::sse2>.data[2] = in_XMM0_Dc;
  local_18.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)sin_angle.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_18.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)sin_angle.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_18.super_simd_register<float,_xsimd::sse2>.data[3] = in_XMM0_Dd;
  fVar5 = ctx->sin_start_angle;
  uVar4 = -(uint)(fVar5 < sin_angle.super_simd_register<float,_xsimd::sse2>.data[0]);
  uVar6 = -(uint)(fVar5 < sin_angle.super_simd_register<float,_xsimd::sse2>.data[1]);
  auVar2._4_4_ = uVar6;
  auVar2._0_4_ = uVar4;
  auVar2._8_4_ = -(uint)(fVar5 < in_XMM0_Dc);
  auVar2._12_4_ = -(uint)(fVar5 < in_XMM0_Dd);
  iVar3 = movmskps(in_EAX,auVar2);
  if (iVar3 == 0) {
    uVar10 = 0x3f8000003f800000;
    fVar7 = fVar5;
  }
  else {
    fVar9 = ctx->sin_end_angle;
    fVar5 = (float)-(uint)(sin_angle.super_simd_register<float,_xsimd::sse2>.data[0] < fVar9);
    fVar7 = (float)-(uint)(sin_angle.super_simd_register<float,_xsimd::sse2>.data[1] < fVar9);
    auVar1._4_4_ = fVar7;
    auVar1._0_4_ = fVar5;
    auVar1._8_4_ = -(uint)(in_XMM0_Dc < fVar9);
    auVar1._12_4_ = -(uint)(in_XMM0_Dd < fVar9);
    iVar3 = movmskps(iVar3,auVar1);
    if (iVar3 == 0) {
      uVar10 = 0;
    }
    else {
      fVar9 = ctx->m;
      bVar11 = xsimd::asin<float,xsimd::sse2>(&local_18);
      fVar8 = ctx->c + bVar11.super_simd_register<float,_xsimd::sse2>.data[0] * fVar9;
      fVar9 = ctx->c + bVar11.super_simd_register<float,_xsimd::sse2>.data[1] * fVar9;
      uVar10 = CONCAT44((uint)fVar7 & uVar6 & (uint)fVar9,(uint)fVar5 & uVar4 & (uint)fVar8) |
               CONCAT44(~uVar6,~uVar4) & 0x3f8000003f800000;
      fVar5 = fVar8;
      fVar7 = fVar9;
    }
  }
  bVar12.super_simd_register<float,_xsimd::sse2>.data[3] = fVar7;
  bVar12.super_simd_register<float,_xsimd::sse2>.data[2] = fVar5;
  bVar12.super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar10;
  bVar12.super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)(uVar10 >> 0x20);
  return (batch)bVar12.super_simd_register<float,_xsimd::sse2>.data;
}

Assistant:

batch weight_from_sin(PolarExtentCoreContext &ctx, batch sin_angle) const {
      auto start = sin_angle <= ctx.sin_start_angle;
      auto end = sin_angle >= ctx.sin_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::asin(sin_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }